

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyTableValue::~IfcPropertyTableValue
          (IfcPropertyTableValue *this,void **vtt)

{
  void **vtt_local;
  IfcPropertyTableValue *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0xc];
  *(void **)&this->field_0x58 = vtt[0xd];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>)._vptr_ObjectHelper
       = (_func_int **)vtt[0xe];
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe(&this->DefinedUnit);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe(&this->DefiningUnit);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->Expression);
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>::~ListOf(&this->DefinedValues);
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>).
              field_0x10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>,vtt + 10
            );
  IfcSimpleProperty::~IfcSimpleProperty((IfcSimpleProperty *)this,vtt + 1);
  return;
}

Assistant:

IfcPropertyTableValue() : Object("IfcPropertyTableValue") {}